

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

int __thiscall Bstrlib::CBString::caselessfind(CBString *this,char *b,int pos)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  CBStringException *this_00;
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  string local_70;
  CBStringException local_50;
  tagbstring local_28;
  
  if (b == (char *)0x0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CBString::CBString::caselessfind NULL.","");
    CBStringException::CBStringException(&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&local_50);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  uVar1 = (this->super_tagbstring).slen;
  iVar2 = -1;
  if ((((uint)pos <= uVar1) && (iVar2 = pos, *b != '\0')) && (iVar2 = -1, uVar1 != pos)) {
    local_28.data = (uchar *)b;
    sVar3 = strlen(b);
    local_28.slen = (int)sVar3;
    local_28.mlen = -1;
    iVar2 = binstrcaseless(&this->super_tagbstring,pos,&local_28);
  }
  return iVar2;
}

Assistant:

int CBString::caselessfind (const char * b, int pos) const {
struct tagbstring t;

	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::caselessfind NULL.");
#else
		return BSTR_ERR;
#endif
	}

	if ((unsigned int) pos > (unsigned int) slen) return BSTR_ERR;
	if ('\0' == b[0]) return pos;
	if (pos == slen) return BSTR_ERR;

	btfromcstr (t, b);
	return binstrcaseless ((bstring) this, pos, (bstring) &t);
}